

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall FIX::BoolField::BoolField(BoolField *this,int field,bool data)

{
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,'\x01');
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003239f8;
  (this->super_FieldBase).m_tag = field;
  (this->super_FieldBase).m_string._M_dataplus._M_p =
       (pointer)&(this->super_FieldBase).m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_FieldBase).m_string,local_40,local_38 + (long)local_40);
  (this->super_FieldBase).m_data._M_dataplus._M_p = (pointer)&(this->super_FieldBase).m_data.field_2
  ;
  (this->super_FieldBase).m_data._M_string_length = 0;
  (this->super_FieldBase).m_data.field_2._M_local_buf[0] = '\0';
  (this->super_FieldBase).m_metrics.m_length = 0;
  (this->super_FieldBase).m_metrics.m_checksum = 0;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00328198;
  return;
}

Assistant:

explicit BoolField(int field, bool data)
      : FieldBase(field, BoolConvertor::convert(data)) {}